

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O0

__m128i scale_1_to_2_phase_0_kernel(__m128i *s,__m128i *f)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  __m128i *in_RSI;
  undefined8 *in_RDI;
  __m128i alVar9;
  __m128i temp;
  __m128i ss [4];
  undefined1 local_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  undefined1 uStack_f4;
  undefined1 uStack_f3;
  undefined1 uStack_f2;
  undefined1 uStack_f1;
  undefined1 uStack_f0;
  undefined1 uStack_ef;
  undefined1 uStack_ee;
  undefined1 uStack_ed;
  undefined1 uStack_ec;
  undefined1 uStack_eb;
  undefined1 uStack_ea;
  undefined1 uStack_e9;
  undefined1 local_e8;
  undefined1 uStack_e7;
  undefined1 uStack_e6;
  undefined1 uStack_e5;
  undefined1 uStack_e4;
  undefined1 uStack_e3;
  undefined1 uStack_e2;
  undefined1 uStack_e1;
  undefined1 uStack_e0;
  undefined1 uStack_df;
  undefined1 uStack_de;
  undefined1 uStack_dd;
  undefined1 uStack_dc;
  undefined1 uStack_db;
  undefined1 uStack_da;
  undefined1 uStack_d9;
  undefined1 local_d8;
  undefined1 uStack_d7;
  undefined1 uStack_d6;
  undefined1 uStack_d5;
  undefined1 uStack_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  undefined1 uStack_d0;
  undefined1 uStack_cf;
  undefined1 uStack_ce;
  undefined1 uStack_cd;
  undefined1 uStack_cc;
  undefined1 uStack_cb;
  undefined1 uStack_ca;
  undefined1 uStack_c9;
  undefined1 local_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  undefined1 uStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined1 uStack_c0;
  undefined1 uStack_bf;
  undefined1 uStack_be;
  undefined1 uStack_bd;
  undefined1 uStack_bc;
  undefined1 uStack_bb;
  undefined1 uStack_ba;
  undefined1 uStack_b9;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  uVar1 = *in_RDI;
  uStack_10 = in_RDI[1];
  uVar2 = in_RDI[2];
  uStack_20 = in_RDI[3];
  local_18._0_1_ = (undefined1)uVar1;
  local_18._1_1_ = (undefined1)((ulong)uVar1 >> 8);
  local_18._2_1_ = (undefined1)((ulong)uVar1 >> 0x10);
  local_18._3_1_ = (undefined1)((ulong)uVar1 >> 0x18);
  local_18._4_1_ = (undefined1)((ulong)uVar1 >> 0x20);
  local_18._5_1_ = (undefined1)((ulong)uVar1 >> 0x28);
  local_18._6_1_ = (undefined1)((ulong)uVar1 >> 0x30);
  local_18._7_1_ = (undefined1)((ulong)uVar1 >> 0x38);
  local_28._0_1_ = (undefined1)uVar2;
  local_28._1_1_ = (undefined1)((ulong)uVar2 >> 8);
  local_28._2_1_ = (undefined1)((ulong)uVar2 >> 0x10);
  local_28._3_1_ = (undefined1)((ulong)uVar2 >> 0x18);
  local_28._4_1_ = (undefined1)((ulong)uVar2 >> 0x20);
  local_28._5_1_ = (undefined1)((ulong)uVar2 >> 0x28);
  local_28._6_1_ = (undefined1)((ulong)uVar2 >> 0x30);
  local_28._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
  local_f8 = (undefined1)local_18;
  uStack_f7 = (undefined1)local_28;
  uStack_f6 = local_18._1_1_;
  uStack_f5 = local_28._1_1_;
  uStack_f4 = local_18._2_1_;
  uStack_f3 = local_28._2_1_;
  uStack_f2 = local_18._3_1_;
  uStack_f1 = local_28._3_1_;
  uStack_f0 = local_18._4_1_;
  uStack_ef = local_28._4_1_;
  uStack_ee = local_18._5_1_;
  uStack_ed = local_28._5_1_;
  uStack_ec = local_18._6_1_;
  uStack_eb = local_28._6_1_;
  uStack_ea = local_18._7_1_;
  uStack_e9 = local_28._7_1_;
  uVar3 = in_RDI[4];
  uStack_30 = in_RDI[5];
  uVar4 = in_RDI[6];
  uStack_40 = in_RDI[7];
  local_38._0_1_ = (undefined1)uVar3;
  local_38._1_1_ = (undefined1)((ulong)uVar3 >> 8);
  local_38._2_1_ = (undefined1)((ulong)uVar3 >> 0x10);
  local_38._3_1_ = (undefined1)((ulong)uVar3 >> 0x18);
  local_38._4_1_ = (undefined1)((ulong)uVar3 >> 0x20);
  local_38._5_1_ = (undefined1)((ulong)uVar3 >> 0x28);
  local_38._6_1_ = (undefined1)((ulong)uVar3 >> 0x30);
  local_38._7_1_ = (undefined1)((ulong)uVar3 >> 0x38);
  local_48._0_1_ = (undefined1)uVar4;
  local_48._1_1_ = (undefined1)((ulong)uVar4 >> 8);
  local_48._2_1_ = (undefined1)((ulong)uVar4 >> 0x10);
  local_48._3_1_ = (undefined1)((ulong)uVar4 >> 0x18);
  local_48._4_1_ = (undefined1)((ulong)uVar4 >> 0x20);
  local_48._5_1_ = (undefined1)((ulong)uVar4 >> 0x28);
  local_48._6_1_ = (undefined1)((ulong)uVar4 >> 0x30);
  local_48._7_1_ = (undefined1)((ulong)uVar4 >> 0x38);
  local_e8 = (undefined1)local_38;
  uStack_e7 = (undefined1)local_48;
  uStack_e6 = local_38._1_1_;
  uStack_e5 = local_48._1_1_;
  uStack_e4 = local_38._2_1_;
  uStack_e3 = local_48._2_1_;
  uStack_e2 = local_38._3_1_;
  uStack_e1 = local_48._3_1_;
  uStack_e0 = local_38._4_1_;
  uStack_df = local_48._4_1_;
  uStack_de = local_38._5_1_;
  uStack_dd = local_48._5_1_;
  uStack_dc = local_38._6_1_;
  uStack_db = local_48._6_1_;
  uStack_da = local_38._7_1_;
  uStack_d9 = local_48._7_1_;
  uVar5 = in_RDI[8];
  uStack_50 = in_RDI[9];
  uVar6 = in_RDI[10];
  uStack_60 = in_RDI[0xb];
  local_58._0_1_ = (undefined1)uVar5;
  local_58._1_1_ = (undefined1)((ulong)uVar5 >> 8);
  local_58._2_1_ = (undefined1)((ulong)uVar5 >> 0x10);
  local_58._3_1_ = (undefined1)((ulong)uVar5 >> 0x18);
  local_58._4_1_ = (undefined1)((ulong)uVar5 >> 0x20);
  local_58._5_1_ = (undefined1)((ulong)uVar5 >> 0x28);
  local_58._6_1_ = (undefined1)((ulong)uVar5 >> 0x30);
  local_58._7_1_ = (undefined1)((ulong)uVar5 >> 0x38);
  local_68._0_1_ = (undefined1)uVar6;
  local_68._1_1_ = (undefined1)((ulong)uVar6 >> 8);
  local_68._2_1_ = (undefined1)((ulong)uVar6 >> 0x10);
  local_68._3_1_ = (undefined1)((ulong)uVar6 >> 0x18);
  local_68._4_1_ = (undefined1)((ulong)uVar6 >> 0x20);
  local_68._5_1_ = (undefined1)((ulong)uVar6 >> 0x28);
  local_68._6_1_ = (undefined1)((ulong)uVar6 >> 0x30);
  local_68._7_1_ = (undefined1)((ulong)uVar6 >> 0x38);
  local_d8 = (undefined1)local_58;
  uStack_d7 = (undefined1)local_68;
  uStack_d6 = local_58._1_1_;
  uStack_d5 = local_68._1_1_;
  uStack_d4 = local_58._2_1_;
  uStack_d3 = local_68._2_1_;
  uStack_d2 = local_58._3_1_;
  uStack_d1 = local_68._3_1_;
  uStack_d0 = local_58._4_1_;
  uStack_cf = local_68._4_1_;
  uStack_ce = local_58._5_1_;
  uStack_cd = local_68._5_1_;
  uStack_cc = local_58._6_1_;
  uStack_cb = local_68._6_1_;
  uStack_ca = local_58._7_1_;
  uStack_c9 = local_68._7_1_;
  uVar7 = in_RDI[0xc];
  uStack_70 = in_RDI[0xd];
  uVar8 = in_RDI[0xe];
  uStack_80 = in_RDI[0xf];
  local_78._0_1_ = (undefined1)uVar7;
  local_78._1_1_ = (undefined1)((ulong)uVar7 >> 8);
  local_78._2_1_ = (undefined1)((ulong)uVar7 >> 0x10);
  local_78._3_1_ = (undefined1)((ulong)uVar7 >> 0x18);
  local_78._4_1_ = (undefined1)((ulong)uVar7 >> 0x20);
  local_78._5_1_ = (undefined1)((ulong)uVar7 >> 0x28);
  local_78._6_1_ = (undefined1)((ulong)uVar7 >> 0x30);
  local_78._7_1_ = (undefined1)((ulong)uVar7 >> 0x38);
  local_88._0_1_ = (undefined1)uVar8;
  local_88._1_1_ = (undefined1)((ulong)uVar8 >> 8);
  local_88._2_1_ = (undefined1)((ulong)uVar8 >> 0x10);
  local_88._3_1_ = (undefined1)((ulong)uVar8 >> 0x18);
  local_88._4_1_ = (undefined1)((ulong)uVar8 >> 0x20);
  local_88._5_1_ = (undefined1)((ulong)uVar8 >> 0x28);
  local_88._6_1_ = (undefined1)((ulong)uVar8 >> 0x30);
  local_88._7_1_ = (undefined1)((ulong)uVar8 >> 0x38);
  local_c8 = (undefined1)local_78;
  uStack_c7 = (undefined1)local_88;
  uStack_c6 = local_78._1_1_;
  uStack_c5 = local_88._1_1_;
  uStack_c4 = local_78._2_1_;
  uStack_c3 = local_88._2_1_;
  uStack_c2 = local_78._3_1_;
  uStack_c1 = local_88._3_1_;
  uStack_c0 = local_78._4_1_;
  uStack_bf = local_88._4_1_;
  uStack_be = local_78._5_1_;
  uStack_bd = local_88._5_1_;
  uStack_bc = local_78._6_1_;
  uStack_bb = local_88._6_1_;
  uStack_ba = local_78._7_1_;
  uStack_b9 = local_88._7_1_;
  local_88 = uVar8;
  local_78 = uVar7;
  local_68 = uVar6;
  local_58 = uVar5;
  local_48 = uVar4;
  local_38 = uVar3;
  local_28 = uVar2;
  local_18 = uVar1;
  alVar9 = convolve8_8_ssse3((__m128i *)&local_f8,in_RSI);
  alVar9[0] = alVar9[0];
  alVar9[1] = alVar9[1];
  return alVar9;
}

Assistant:

static inline __m128i scale_1_to_2_phase_0_kernel(const __m128i *const s,
                                                  const __m128i *const f) {
  __m128i ss[4], temp;

  ss[0] = _mm_unpacklo_epi8(s[0], s[1]);
  ss[1] = _mm_unpacklo_epi8(s[2], s[3]);
  ss[2] = _mm_unpacklo_epi8(s[4], s[5]);
  ss[3] = _mm_unpacklo_epi8(s[6], s[7]);
  temp = convolve8_8_ssse3(ss, f);
  return _mm_packus_epi16(temp, temp);
}